

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplace_back<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
           *this,pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  ulong uVar1;
  Expression *pEVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  EVP_PKEY_CTX *pEVar8;
  undefined8 *puVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  
  puVar9 = (undefined8 *)(*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pEVar2 = args->second;
    *puVar9 = args->first;
    puVar9[1] = pEVar2;
    lVar10 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar10 + 1;
    return (reference)(*(long *)this + (lVar10 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar10 = (long)puVar9 - *(long *)this;
  puVar4 = (undefined8 *)operator_new((long)pEVar8 << 4);
  pEVar2 = args->second;
  *(undefined8 *)((long)puVar4 + lVar10) = args->first;
  ((undefined8 *)((long)puVar4 + lVar10))[1] = pEVar2;
  puVar7 = *(undefined8 **)this;
  puVar5 = puVar7 + *(long *)(this + 8) * 2;
  puVar6 = puVar4;
  if (puVar5 == puVar9) {
    for (; puVar7 != puVar9; puVar7 = puVar7 + 2) {
      uVar3 = puVar7[1];
      *puVar6 = *puVar7;
      puVar6[1] = uVar3;
      puVar6 = puVar6 + 2;
    }
  }
  else {
    for (; puVar7 != puVar9; puVar7 = puVar7 + 2) {
      uVar3 = puVar7[1];
      *puVar6 = *puVar7;
      puVar6[1] = uVar3;
      puVar6 = puVar6 + 2;
    }
    puVar7 = (undefined8 *)(lVar10 + (long)puVar4);
    for (; puVar9 != puVar5; puVar9 = puVar9 + 2) {
      uVar3 = puVar9[1];
      puVar7[2] = *puVar9;
      puVar7[3] = uVar3;
      puVar7 = puVar7 + 2;
    }
  }
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
  cleanup((SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
           *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar8;
  *(undefined8 **)this = puVar4;
  return (reference)((long)puVar4 + lVar10);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }